

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O1

atf_error_t microatf_tp_add_tcs(atf_tp_t *tp)

{
  char cVar1;
  atf_error_t paVar2;
  
  paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_epoll__simple);
  cVar1 = atf_is_error(paVar2);
  if (cVar1 == '\0') {
    paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_epoll__poll_flags);
    cVar1 = atf_is_error(paVar2);
    if (cVar1 == '\0') {
      paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_epoll__leakcheck);
      cVar1 = atf_is_error(paVar2);
      if (cVar1 == '\0') {
        paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_epoll__fd_exhaustion);
        cVar1 = atf_is_error(paVar2);
        if (cVar1 == '\0') {
          paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_epoll__invalid_op);
          cVar1 = atf_is_error(paVar2);
          if (cVar1 == '\0') {
            paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_epoll__invalid_op2);
            cVar1 = atf_is_error(paVar2);
            if (cVar1 == '\0') {
              paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_epoll__rdhup_linux);
              cVar1 = atf_is_error(paVar2);
              if (cVar1 == '\0') {
                paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_epoll__simple_wait);
                cVar1 = atf_is_error(paVar2);
                if (cVar1 == '\0') {
                  paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_epoll__event_size);
                  cVar1 = atf_is_error(paVar2);
                  if (cVar1 == '\0') {
                    paVar2 = (atf_error_t)
                             microatf_tp_add_tc(tp,&microatf_tc_epoll__recursive_register);
                    cVar1 = atf_is_error(paVar2);
                    if (cVar1 == '\0') {
                      paVar2 = (atf_error_t)
                               microatf_tp_add_tc(tp,&microatf_tc_epoll__simple_epollin);
                      cVar1 = atf_is_error(paVar2);
                      if (cVar1 == '\0') {
                        paVar2 = (atf_error_t)
                                 microatf_tp_add_tc(tp,&microatf_tc_epoll__sleep_argument);
                        cVar1 = atf_is_error(paVar2);
                        if (cVar1 == '\0') {
                          paVar2 = (atf_error_t)
                                   microatf_tp_add_tc(tp,&microatf_tc_epoll__remove_nonexistent);
                          cVar1 = atf_is_error(paVar2);
                          if (cVar1 == '\0') {
                            paVar2 = (atf_error_t)
                                     microatf_tp_add_tc(tp,&microatf_tc_epoll__add_remove);
                            cVar1 = atf_is_error(paVar2);
                            if (cVar1 == '\0') {
                              paVar2 = (atf_error_t)
                                       microatf_tp_add_tc(tp,&microatf_tc_epoll__add_existing);
                              cVar1 = atf_is_error(paVar2);
                              if (cVar1 == '\0') {
                                paVar2 = (atf_error_t)
                                         microatf_tp_add_tc(tp,&microatf_tc_epoll__modify_existing);
                                cVar1 = atf_is_error(paVar2);
                                if (cVar1 == '\0') {
                                  paVar2 = (atf_error_t)
                                           microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__modify_nonexisting);
                                  cVar1 = atf_is_error(paVar2);
                                  if (cVar1 == '\0') {
                                    paVar2 = (atf_error_t)
                                             microatf_tp_add_tc(tp,&microatf_tc_epoll__poll_only_fd)
                                    ;
                                    cVar1 = atf_is_error(paVar2);
                                    if (cVar1 == '\0') {
                                      paVar2 = (atf_error_t)
                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__no_epollin_on_closed_empty_pipe
                                                  );
                                      cVar1 = atf_is_error(paVar2);
                                      if (cVar1 == '\0') {
                                        paVar2 = (atf_error_t)
                                                 microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__write_to_pipe_until_full);
                                        cVar1 = atf_is_error(paVar2);
                                        if (cVar1 == '\0') {
                                          paVar2 = (atf_error_t)
                                                   microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__realtime_timer);
                                          cVar1 = atf_is_error(paVar2);
                                          if (cVar1 == '\0') {
                                            paVar2 = (atf_error_t)
                                                     microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__simple_signalfd);
                                            cVar1 = atf_is_error(paVar2);
                                            if (cVar1 == '\0') {
                                              paVar2 = (atf_error_t)
                                                       microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__signalfd_poll_sigusr1);
                                              cVar1 = atf_is_error(paVar2);
                                              if (cVar1 == '\0') {
                                                paVar2 = (atf_error_t)
                                                         microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__signalfd_in_thread);
                                                cVar1 = atf_is_error(paVar2);
                                                if (cVar1 == '\0') {
                                                  paVar2 = (atf_error_t)
                                                           microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__socket_shutdown);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epollhup_on_fresh_socket);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epollout_on_connecting_socket);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epollpri);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epollpri_oobinline);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epollpri_oobinline_lt);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__timeout_on_listening_socket);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epollerr_on_closed_pipe);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__shutdown_behavior);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__datagram_connection);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epollout_on_own_shutdown);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__remove_closed);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__remove_closed_when_same_fd_open
                                                  );
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__add_different_file_with_same_fd_value
                                                  );
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__invalid_writes);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__using_real_close);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epoll_pwait);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__cloexec);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__fcntl_fl);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__fcntl_issue49);
                                                  cVar1 = atf_is_error(paVar2);
                                                  if (cVar1 == '\0') {
                                                    paVar2 = (atf_error_t)atf_no_error();
                                                    return paVar2;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return paVar2;
}

Assistant:

ATF_TP_ADD_TCS(tp)
{
	ATF_TP_ADD_TC(tp, epoll__simple);
#ifndef USE_EPOLLRDHUP_LINUX_DEFINITION
	ATF_TP_ADD_TC(tp, epoll__poll_flags);
#endif
	ATF_TP_ADD_TC(tp, epoll__leakcheck);
	ATF_TP_ADD_TC(tp, epoll__fd_exhaustion);
	ATF_TP_ADD_TC(tp, epoll__invalid_op);
	ATF_TP_ADD_TC(tp, epoll__invalid_op2);
	ATF_TP_ADD_TC(tp, epoll__rdhup_linux);
	ATF_TP_ADD_TC(tp, epoll__simple_wait);
	ATF_TP_ADD_TC(tp, epoll__event_size);
	ATF_TP_ADD_TC(tp, epoll__recursive_register);
	ATF_TP_ADD_TC(tp, epoll__simple_epollin);
	ATF_TP_ADD_TC(tp, epoll__sleep_argument);
	ATF_TP_ADD_TC(tp, epoll__remove_nonexistent);
	ATF_TP_ADD_TC(tp, epoll__add_remove);
	ATF_TP_ADD_TC(tp, epoll__add_existing);
	ATF_TP_ADD_TC(tp, epoll__modify_existing);
	ATF_TP_ADD_TC(tp, epoll__modify_nonexisting);
	ATF_TP_ADD_TC(tp, epoll__poll_only_fd);
	ATF_TP_ADD_TC(tp, epoll__no_epollin_on_closed_empty_pipe);
	ATF_TP_ADD_TC(tp, epoll__write_to_pipe_until_full);
	ATF_TP_ADD_TC(tp, epoll__realtime_timer);
	ATF_TP_ADD_TC(tp, epoll__simple_signalfd);
	ATF_TP_ADD_TC(tp, epoll__signalfd_poll_sigusr1);
	ATF_TP_ADD_TC(tp, epoll__signalfd_in_thread);
	ATF_TP_ADD_TC(tp, epoll__socket_shutdown);
	ATF_TP_ADD_TC(tp, epoll__epollhup_on_fresh_socket);
	ATF_TP_ADD_TC(tp, epoll__epollout_on_connecting_socket);
	ATF_TP_ADD_TC(tp, epoll__epollpri);
	ATF_TP_ADD_TC(tp, epoll__epollpri_oobinline);
	ATF_TP_ADD_TC(tp, epoll__epollpri_oobinline_lt);
	ATF_TP_ADD_TC(tp, epoll__timeout_on_listening_socket);
	ATF_TP_ADD_TC(tp, epoll__epollerr_on_closed_pipe);
	ATF_TP_ADD_TC(tp, epoll__shutdown_behavior);
	ATF_TP_ADD_TC(tp, epoll__datagram_connection);
	ATF_TP_ADD_TC(tp, epoll__epollout_on_own_shutdown);
	ATF_TP_ADD_TC(tp, epoll__remove_closed);
	ATF_TP_ADD_TC(tp, epoll__remove_closed_when_same_fd_open);
	ATF_TP_ADD_TC(tp, epoll__add_different_file_with_same_fd_value);
	ATF_TP_ADD_TC(tp, epoll__invalid_writes);
	ATF_TP_ADD_TC(tp, epoll__using_real_close);
	ATF_TP_ADD_TC(tp, epoll__epoll_pwait);
	ATF_TP_ADD_TC(tp, epoll__cloexec);
	ATF_TP_ADD_TC(tp, epoll__fcntl_fl);
	ATF_TP_ADD_TC(tp, epoll__fcntl_issue49);

	return atf_no_error();
}